

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O2

void fld_sq(limb_t *res,limb_t *x)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  
  lVar1 = *x;
  lVar15 = x[1];
  lVar5 = lVar15 * 2;
  lVar2 = x[2];
  lVar6 = lVar2 * 2;
  lVar3 = x[3];
  lVar4 = x[4];
  lVar11 = lVar3 * 0x13;
  lVar21 = lVar4 * 0x13;
  uVar8 = lVar11 * lVar6 + lVar21 * lVar5;
  uVar9 = uVar8 + lVar1 * lVar1;
  lVar16 = SUB168(SEXT816(lVar11) * SEXT816(lVar6),8) + SUB168(SEXT816(lVar21) * SEXT816(lVar5),8) +
           (ulong)CARRY8(lVar11 * lVar6,lVar21 * lVar5) + SUB168(SEXT816(lVar1) * SEXT816(lVar1),8)
           + (ulong)CARRY8(uVar8,lVar1 * lVar1);
  uVar18 = lVar15 * lVar15 + lVar1 * lVar6;
  lVar7 = lVar3 * 2;
  uVar20 = lVar21 * lVar7 + uVar18;
  uVar19 = lVar5 * lVar2 + lVar1 * lVar7;
  uVar10 = lVar21 * lVar4 + uVar19;
  uVar8 = lVar1 * lVar4 * 2;
  uVar17 = lVar16 * 0x2000 | uVar9 >> 0x33;
  uVar12 = lVar11 * lVar3 + lVar21 * lVar6;
  uVar13 = uVar12 + lVar1 * lVar5;
  uVar14 = uVar13 + uVar17;
  lVar11 = SUB168(SEXT816(lVar11) * SEXT816(lVar3),8) + SUB168(SEXT816(lVar21) * SEXT816(lVar6),8) +
           (ulong)CARRY8(lVar11 * lVar3,lVar21 * lVar6) + SUB168(SEXT816(lVar1) * SEXT816(lVar5),8)
           + (ulong)CARRY8(uVar12,lVar1 * lVar5) + (lVar16 >> 0x33) + (ulong)CARRY8(uVar13,uVar17);
  uVar12 = lVar11 * 0x2000 | uVar14 >> 0x33;
  uVar17 = uVar12 + uVar20;
  lVar15 = (lVar11 >> 0x33) +
           SUB168(SEXT816(lVar21) * SEXT816(lVar7),8) +
           SUB168(SEXT816(lVar15) * SEXT816(lVar15),8) + SUB168(SEXT816(lVar1) * SEXT816(lVar6),8) +
           (ulong)CARRY8(lVar15 * lVar15,lVar1 * lVar6) + (ulong)CARRY8(lVar21 * lVar7,uVar18) +
           (ulong)CARRY8(uVar12,uVar20);
  uVar12 = lVar15 * 0x2000 | uVar17 >> 0x33;
  uVar18 = uVar12 + uVar10;
  lVar15 = (lVar15 >> 0x33) +
           SUB168(SEXT816(lVar21) * SEXT816(lVar4),8) +
           SUB168(SEXT816(lVar5) * SEXT816(lVar2),8) + SUB168(SEXT816(lVar1) * SEXT816(lVar7),8) +
           (ulong)CARRY8(lVar5 * lVar2,lVar1 * lVar7) + (ulong)CARRY8(lVar21 * lVar4,uVar19) +
           (ulong)CARRY8(uVar12,uVar10);
  uVar19 = lVar15 * 0x2000 | uVar18 >> 0x33;
  uVar10 = lVar2 * lVar2 + lVar3 * lVar5;
  uVar12 = uVar10 + uVar8;
  uVar13 = uVar12 + uVar19;
  uVar8 = ((SUB168(SEXT816(lVar2) * SEXT816(lVar2),8) + SUB168(SEXT816(lVar3) * SEXT816(lVar5),8) +
            (ulong)CARRY8(lVar2 * lVar2,lVar3 * lVar5) +
            SUB168(SEXT816(lVar1) * SEXT816(lVar4 * 2),8) + (ulong)CARRY8(uVar10,uVar8) +
            (lVar15 >> 0x33) + (ulong)CARRY8(uVar12,uVar19)) * 0x2000 | uVar13 >> 0x33) * 0x13 +
          (uVar9 & 0x7ffffffffffff);
  res[1] = (uVar14 & 0x7ffffffffffff) + ((long)uVar8 >> 0x33);
  *res = uVar8 & 0x7ffffffffffff;
  res[2] = uVar17 & 0x7ffffffffffff;
  res[3] = uVar18 & 0x7ffffffffffff;
  res[4] = uVar13 & 0x7ffffffffffff;
  return;
}

Assistant:

void
fld_sq(fld_t res, const fld_t x)
{
	limb_t x2_1, x2_2, x2_3, x2_4, x19_3, x19_4, tmp;
	llimb_t c[5];

	x2_1 = 2*x[1];
	x2_2 = 2*x[2];
	x2_3 = 2*x[3];
	x2_4 = 2*x[4];
	x19_3 = 19*x[3];
	x19_4 = 19*x[4];

	c[0] = (llimb_t)x[0]*x[0] + (llimb_t)x2_1*x19_4 + (llimb_t)x2_2*x19_3;
	c[1] = (llimb_t)x[0]*x2_1 + (llimb_t)x2_2*x19_4 + (llimb_t)x19_3*x[3];
	c[2] = (llimb_t)x[0]*x2_2 + (llimb_t)x[1]*x[1] + (llimb_t)x2_3*x19_4;
	c[3] = (llimb_t)x[0]*x2_3 + (llimb_t)x2_1*x[2] + (llimb_t)x19_4*x[4];
	c[4] = (llimb_t)x[0]*x2_4 + (llimb_t)x2_1*x[3] + (llimb_t)x[2]*x[2];

	c[1] += c[0] >> FLD_LIMB_BITS;
	c[2] += c[1] >> FLD_LIMB_BITS;
	c[3] += c[2] >> FLD_LIMB_BITS;
	c[4] += c[3] >> FLD_LIMB_BITS;

	tmp = (c[0] & FLD_LIMB_MASK) + 19*(c[4] >> FLD_LIMB_BITS);
	res[1] = (c[1] & FLD_LIMB_MASK) + (tmp >> FLD_LIMB_BITS);

	res[0] = tmp & FLD_LIMB_MASK;
	res[2] = c[2] & FLD_LIMB_MASK;
	res[3] = c[3] & FLD_LIMB_MASK;
	res[4] = c[4] & FLD_LIMB_MASK;
}